

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O3

int E_ExtLoop(int type,int si1,int sj1,vrna_param_t *P)

{
  int iVar1;
  int *piVar2;
  
  if ((sj1 | si1) < 0) {
    if (si1 < 0) {
      if (sj1 < 0) {
        iVar1 = 0;
        goto LAB_0011ed8c;
      }
      piVar2 = P->dangle3[type] + (uint)sj1;
    }
    else {
      piVar2 = P->dangle5[type] + (uint)si1;
    }
  }
  else {
    piVar2 = P->mismatchExt[type][(uint)si1] + (uint)sj1;
  }
  iVar1 = *piVar2;
LAB_0011ed8c:
  if (2 < type) {
    iVar1 = iVar1 + P->TerminalAU;
  }
  return iVar1;
}

Assistant:

PUBLIC int
E_ExtLoop(int           type,
          int           si1,
          int           sj1,
          vrna_param_t  *P)
{
  int energy = 0;

  if (si1 >= 0 && sj1 >= 0)
    energy += P->mismatchExt[type][si1][sj1];
  else if (si1 >= 0)
    energy += P->dangle5[type][si1];
  else if (sj1 >= 0)
    energy += P->dangle3[type][sj1];

  if (type > 2)
    energy += P->TerminalAU;

  return energy;
}